

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::EqualityComparisonOp<false>::EqualityComparisonOp
          (EqualityComparisonOp<false> *this,GeneratorState *state,
          ConstValueRangeAccess inValueRange)

{
  int iVar1;
  ValueRangeAccess valueRange_00;
  byte bVar2;
  pointer state_00;
  bool bVar3;
  VariableType *pVVar4;
  Random *pRVar5;
  ShaderParameters *pSVar6;
  bool *pbVar7;
  float *aMin;
  float *aMax;
  float *bMin;
  float *bMax;
  int *aMin_00;
  int *aMax_00;
  int *bMin_00;
  int *bMax_00;
  bool *aMax_01;
  bool *bMin_01;
  bool *bMax_01;
  ConstStridedValueAccess<1> CVar8;
  ValueAccess VVar9;
  ConstStridedValueAccess<1> local_4b8;
  ConstStridedValueAccess<1> local_4a8;
  ConstStridedValueAccess<1> local_498;
  ConstStridedValueAccess<1> local_488;
  ConstStridedValueAccess<1> local_478;
  ConstStridedValueAccess<1> local_468;
  ConstStridedValueAccess<1> local_458;
  ConstStridedValueAccess<1> local_448;
  ConstStridedValueAccess<1> local_438;
  ConstStridedValueAccess<1> local_428;
  ConstStridedValueAccess<1> local_418;
  ConstStridedValueAccess<1> local_408;
  ValueRangeAccess local_3f8;
  undefined1 local_3e0 [8];
  ValueRangeAccess b;
  undefined1 local_3b0 [8];
  ValueRangeAccess a;
  undefined1 auStack_380 [7];
  bool dstMax;
  Scalar *local_378;
  byte local_36d;
  int local_36c;
  undefined1 local_368 [3];
  bool dstMin;
  int elementNdx;
  ValueRange local_318;
  VariableType local_298;
  ValueRange local_248;
  int local_1c4;
  int local_1c0;
  int numElements;
  int availableLevels;
  Type inBaseType;
  Type inBaseTypes [2];
  Scalar *pSStack_1a8;
  Scalar *local_1a0;
  VariableType local_198;
  ValueRange local_148;
  VariableType *local_b8;
  Scalar *pSStack_b0;
  Scalar *local_a8;
  undefined1 local_98 [8];
  ValueRange valueRange;
  GeneratorState *state_local;
  EqualityComparisonOp<false> *this_local;
  
  valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)state;
  BinaryOp<8,_(rsg::Associativity)0>::BinaryOp
            (&this->super_BinaryOp<8,_(rsg::Associativity)0>,CMP_NE);
  (this->super_BinaryOp<8,_(rsg::Associativity)0>).super_Expression._vptr_Expression =
       (_func_int **)&PTR__EqualityComparisonOp_00cc02b8;
  local_a8 = inValueRange.m_max;
  local_b8 = inValueRange.m_type;
  pSStack_b0 = inValueRange.m_min;
  ValueRange::ValueRange((ValueRange *)local_98,inValueRange);
  pVVar4 = ValueRange::getType((ValueRange *)local_98);
  bVar3 = VariableType::isVoid(pVVar4);
  if (bVar3) {
    VariableType::VariableType(&local_198,TYPE_BOOL,1);
    ValueRange::ValueRange(&local_148,&local_198);
    ValueRange::operator=((ValueRange *)local_98,&local_148);
    ValueRange::~ValueRange(&local_148);
    VariableType::~VariableType(&local_198);
    state_00 = valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    ValueRange::asAccess((ValueRangeAccess *)inBaseTypes,(ValueRange *)local_98);
    valueRange_00.super_ConstValueRangeAccess.m_min = pSStack_1a8;
    valueRange_00.super_ConstValueRangeAccess.m_type = (VariableType *)inBaseTypes;
    valueRange_00.super_ConstValueRangeAccess.m_max = local_1a0;
    computeRandomValueRange((GeneratorState *)state_00,valueRange_00);
  }
  pVVar4 = ValueRange::getType((ValueRange *)local_98);
  VariableType::operator=(&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_type,pVVar4);
  ValueStorage<64>::setStorage
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_value,
             &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_type);
  _availableLevels = 0x200000001;
  pRVar5 = GeneratorState::getRandom
                     ((GeneratorState *)
                      valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  numElements = de::Random::choose<rsg::VariableType::Type,rsg::VariableType::Type*>
                          (pRVar5,(Type *)&availableLevels,inBaseTypes);
  pSVar6 = GeneratorState::getShaderParameters
                     ((GeneratorState *)
                      valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar1 = pSVar6->maxExpressionDepth;
  local_1c0 = GeneratorState::getExpressionDepth
                        ((GeneratorState *)
                         valueRange.m_max.
                         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  local_1c0 = iVar1 - local_1c0;
  pRVar5 = GeneratorState::getRandom
                     ((GeneratorState *)
                      valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1c4 = de::Random::getInt(pRVar5,1,(uint)(2 < local_1c0) * 3 + 1);
  VariableType::VariableType(&local_298,numElements,local_1c4);
  ValueRange::ValueRange(&local_248,&local_298);
  ValueRange::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange,&local_248);
  ValueRange::~ValueRange(&local_248);
  VariableType::~VariableType(&local_298);
  VariableType::VariableType((VariableType *)local_368,numElements,local_1c4);
  ValueRange::ValueRange(&local_318,(VariableType *)local_368);
  ValueRange::operator=
            (&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange,&local_318);
  ValueRange::~ValueRange(&local_318);
  VariableType::~VariableType((VariableType *)local_368);
  for (local_36c = 0; local_36c < local_1c4; local_36c = local_36c + 1) {
    CVar8 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_98);
    _auStack_380 = CVar8;
    pbVar7 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)auStack_380);
    local_36d = *pbVar7 & 1;
    VVar9 = ValueRange::getMax((ValueRange *)local_98);
    a.super_ConstValueRangeAccess.m_max = (Scalar *)VVar9.super_ConstStridedValueAccess<1>.m_type;
    pbVar7 = StridedValueAccess<1>::asBool
                       ((StridedValueAccess<1> *)&a.super_ConstValueRangeAccess.m_max);
    bVar3 = (bool)(*pbVar7 & 1);
    ValueRange::asAccess
              ((ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max,
               &(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_leftValueRange);
    ValueRangeAccess::component
              ((ValueRangeAccess *)local_3b0,
               (ValueRangeAccess *)&b.super_ConstValueRangeAccess.m_max,local_36c);
    ValueRange::asAccess
              (&local_3f8,&(this->super_BinaryOp<8,_(rsg::Associativity)0>).m_rightValueRange);
    ValueRangeAccess::component((ValueRangeAccess *)local_3e0,&local_3f8,local_36c);
    if (numElements == 1) {
      pRVar5 = GeneratorState::getRandom
                         ((GeneratorState *)
                          valueRange.m_max.
                          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar2 = local_36d;
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_3b0);
      local_408 = CVar8;
      aMin = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_408);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_3b0);
      local_418 = CVar8;
      aMax = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_418);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_3e0);
      local_428 = CVar8;
      bMin = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_428);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_3e0);
      local_438 = CVar8;
      bMax = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_438);
      (anonymous_namespace)::computeEqualityValueRange<false,float>
                (pRVar5,(bool)(bVar2 & 1),bVar3,aMin,aMax,bMin,bMax);
    }
    else if (numElements == 2) {
      pRVar5 = GeneratorState::getRandom
                         ((GeneratorState *)
                          valueRange.m_max.
                          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar2 = local_36d;
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_3b0);
      local_448 = CVar8;
      aMin_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_448);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_3b0);
      local_458 = CVar8;
      aMax_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_458);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_3e0);
      local_468 = CVar8;
      bMin_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_468);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_3e0);
      local_478 = CVar8;
      bMax_00 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_478);
      (anonymous_namespace)::computeEqualityValueRange<false,int>
                (pRVar5,(bool)(bVar2 & 1),bVar3,aMin_00,aMax_00,bMin_00,bMax_00);
    }
    else {
      pRVar5 = GeneratorState::getRandom
                         ((GeneratorState *)
                          valueRange.m_max.
                          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      bVar2 = local_36d;
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_3b0);
      local_488 = CVar8;
      pbVar7 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_488);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_3b0);
      local_498 = CVar8;
      aMax_01 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_498);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin((ValueRangeAccess *)local_3e0);
      local_4a8 = CVar8;
      bMin_01 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_4a8);
      CVar8 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax((ValueRangeAccess *)local_3e0);
      local_4b8 = CVar8;
      bMax_01 = StridedValueAccess<1>::asBool((StridedValueAccess<1> *)&local_4b8);
      (anonymous_namespace)::computeEqualityValueRange<false,bool>
                (pRVar5,(bool)(bVar2 & 1),bVar3,pbVar7,aMax_01,bMin_01,bMax_01);
    }
  }
  ValueRange::~ValueRange((ValueRange *)local_98);
  return;
}

Assistant:

EqualityComparisonOp<IsEqual>::EqualityComparisonOp (GeneratorState& state, ConstValueRangeAccess inValueRange)
	: BinaryOp<8, ASSOCIATIVITY_LEFT>(IsEqual ? Token::CMP_EQ : Token::CMP_NE)
{
	ValueRange valueRange = inValueRange;

	if (valueRange.getType().isVoid())
	{
		valueRange = ValueRange(VariableType(VariableType::TYPE_BOOL, 1));
		computeRandomValueRange(state, valueRange.asAccess());
	}

	// Choose type, allocate storage for execution
	this->m_type = valueRange.getType();
	this->m_value.setStorage(this->m_type);

	// Choose random input type
	VariableType::Type inBaseTypes[]	= { VariableType::TYPE_FLOAT, VariableType::TYPE_INT };
	VariableType::Type inBaseType		= state.getRandom().choose<VariableType::Type>(&inBaseTypes[0], &inBaseTypes[DE_LENGTH_OF_ARRAY(inBaseTypes)]);
	int					availableLevels	= state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();
	int					numElements		= state.getRandom().getInt(1, availableLevels >= 3 ? 4 : 1);

	// Initialize storage for input value ranges
	this->m_rightValueRange	= ValueRange(VariableType(inBaseType, numElements));
	this->m_leftValueRange	= ValueRange(VariableType(inBaseType, numElements));

	// Compute range for b that satisfies requested value range
	for (int elementNdx = 0; elementNdx < numElements; elementNdx++)
	{
		bool					dstMin	= valueRange.getMin().asBool();
		bool					dstMax	= valueRange.getMax().asBool();

		ValueRangeAccess		a		= this->m_leftValueRange.asAccess().component(elementNdx);
		ValueRangeAccess		b		= this->m_rightValueRange.asAccess().component(elementNdx);

		if (inBaseType == VariableType::TYPE_FLOAT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asFloat(), a.getMax().asFloat(),
											   b.getMin().asFloat(), b.getMax().asFloat());
		else if (inBaseType == VariableType::TYPE_INT)
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asInt(), a.getMax().asInt(),
											   b.getMin().asInt(), b.getMax().asInt());
		else
		{
			DE_ASSERT(inBaseType == VariableType::TYPE_BOOL);
			computeEqualityValueRange<IsEqual>(state.getRandom(), dstMin, dstMax,
											   a.getMin().asBool(), a.getMax().asBool(),
											   b.getMin().asBool(), b.getMax().asBool());
		}
	}
}